

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

floatx80 floatx80_mul(floatx80 a,floatx80 b)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int32 iVar4;
  floatx80 fVar5;
  floatx80 fVar6;
  int32 aExp;
  int32 bExp;
  bits64 aSig;
  bits64 bSig;
  ulong local_40;
  bits64 local_38;
  
  aSig = a.low;
  fVar5.low = b.low;
  aExp = a._0_4_ & 0x7fff;
  uVar3 = b._0_4_ & 0x7fff;
  uVar1 = b._0_4_ ^ a._0_4_;
  bExp = uVar3;
  bSig = fVar5.low;
  if ((short)aExp == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        uVar3 != 0x7fff)) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 ||
          fVar5.low != 0) {
LAB_003387b7:
        uVar2 = (ulong)(uVar1 | 0x7fff);
        fVar5.low = 0x8000000000000000;
        goto LAB_003387f1;
      }
LAB_003387c2:
      float_exception_flags = float_exception_flags | 1;
      fVar5.low = 0xffffffffffffffff;
      uVar2 = CONCAT62((uint6)(ushort)(uVar1 >> 0x10),0xffff);
      goto LAB_003387f1;
    }
LAB_00338701:
    fVar5._0_8_ = b._0_8_ & 0xffffffff;
    fVar5 = propagateFloatx80NaN(a,fVar5);
  }
  else {
    if (uVar3 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || aSig != 0)
        goto LAB_003387b7;
        goto LAB_003387c2;
      }
      goto LAB_00338701;
    }
    if ((short)aExp == 0) {
      if (aSig != 0) {
        normalizeFloatx80Subnormal(aSig,&aExp,&aSig);
        goto LAB_00338731;
      }
LAB_00338802:
      uVar2 = (ulong)(uVar1 & 0x8000);
      fVar5.low = 0;
      goto LAB_003387f1;
    }
LAB_00338731:
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
      if (fVar5.low == 0) goto LAB_00338802;
      normalizeFloatx80Subnormal(fVar5.low,&bExp,&bSig);
      fVar5.low = bSig;
      uVar3 = bExp;
    }
    iVar4 = aExp;
    mul64To128(aSig,fVar5.low,&local_38,&local_40);
    if ((long)local_38 < 1) {
      iVar4 = uVar3 + iVar4 + -0x3ffe;
    }
    else {
      local_38 = local_38 << 1 | local_40 >> 0x3f;
      local_40 = local_40 * 2;
      iVar4 = uVar3 + iVar4 + -0x3fff;
    }
    fVar5 = roundAndPackFloatx80
                      (floatx80_rounding_precision,(flag)((uVar1 & 0xffff) >> 0xf),iVar4,local_38,
                       local_40);
  }
  uVar2 = (ulong)fVar5._0_4_;
LAB_003387f1:
  fVar6.low = fVar5.low;
  fVar6._0_8_ = uVar2;
  return fVar6;
}

Assistant:

floatx80 floatx80_mul( floatx80 a, floatx80 b )
{
	flag aSign, bSign, zSign;
	int32 aExp, bExp, zExp;
	bits64 aSig, bSig, zSig0, zSig1;
	floatx80 z;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	bSig = extractFloatx80Frac( b );
	bExp = extractFloatx80Exp( b );
	bSign = extractFloatx80Sign( b );
	zSign = aSign ^ bSign;
	if ( aExp == 0x7FFF ) {
		if (    (bits64) ( aSig<<1 )
				|| ( ( bExp == 0x7FFF ) && (bits64) ( bSig<<1 ) ) ) {
			return propagateFloatx80NaN( a, b );
		}
		if ( ( bExp | bSig ) == 0 ) goto invalid;
		return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
	}
	if ( bExp == 0x7FFF ) {
		if ( (bits64) ( bSig<<1 ) ) return propagateFloatx80NaN( a, b );
		if ( ( aExp | aSig ) == 0 ) {
	invalid:
			float_raise( float_flag_invalid );
			z.low = floatx80_default_nan_low;
			z.high = floatx80_default_nan_high;
			return z;
		}
		return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
	}
	if ( aExp == 0 ) {
		if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
		normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
	}
	if ( bExp == 0 ) {
		if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
		normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
	}
	zExp = aExp + bExp - 0x3FFE;
	mul64To128( aSig, bSig, &zSig0, &zSig1 );
	if ( 0 < (sbits64) zSig0 ) {
		shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
		--zExp;
	}
	return
		roundAndPackFloatx80(
			floatx80_rounding_precision, zSign, zExp, zSig0, zSig1 );

}